

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O1

bool __thiscall SequenceDistanceGraphPath::is_canonical(SequenceDistanceGraphPath *this)

{
  uint uVar1;
  size_type __n;
  ulong uVar2;
  SequenceDistanceGraphPath rp;
  string local_78;
  SequenceDistanceGraphPath local_58;
  string local_38;
  
  std::vector<long,_std::allocator<long>_>::vector(&local_58.nodes,&this->nodes);
  local_58.sg = this->sg;
  reverse(&local_58);
  sequence_abi_cxx11_(&local_78,this);
  sequence_abi_cxx11_(&local_38,&local_58);
  __n = local_78._M_string_length;
  if (local_38._M_string_length < local_78._M_string_length) {
    __n = local_38._M_string_length;
  }
  if (__n == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = memcmp(local_78._M_dataplus._M_p,local_38._M_dataplus._M_p,__n);
    uVar2 = (ulong)uVar1;
  }
  if ((int)uVar2 == 0) {
    uVar2 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_78._M_string_length - local_38._M_string_length)) {
      uVar2 = local_78._M_string_length - local_38._M_string_length;
    }
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (bool)((byte)(uVar2 >> 0x1f) & 1);
}

Assistant:

bool SequenceDistanceGraphPath::is_canonical() {
    auto rp=*this;
    rp.reverse();
    return sequence()< rp.sequence();
}